

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

void Assimp::IFC::ConvertTransformOperator(IfcMatrix4 *out,IfcCartesianTransformationOperator *op)

{
  bool bVar1;
  IfcCartesianPoint *in;
  IfcCartesianTransformationOperator3D *pIVar2;
  Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *pLVar3;
  IfcDirection *pIVar4;
  IfcCartesianTransformationOperator3DnonUniform *pIVar5;
  double *pdVar6;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  IfcCartesianTransformationOperator3DnonUniform *local_2c8;
  aiMatrix4x4t<double> local_2c0;
  aiMatrix4x4t<double> local_240;
  undefined1 local_1c0 [8];
  IfcMatrix4 s;
  double local_138;
  double local_130;
  IfcFloat sc;
  IfcCartesianTransformationOperator3DnonUniform *nuni;
  IfcVector3 vscale;
  IfcMatrix4 locm;
  IfcCartesianTransformationOperator3D *op2;
  IfcVector3 z;
  IfcVector3 y;
  IfcVector3 x;
  IfcVector3 loc;
  IfcCartesianTransformationOperator *op_local;
  IfcMatrix4 *out_local;
  
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&x.z);
  in = STEP::Lazy::operator_cast_to_IfcCartesianPoint_((Lazy *)&op->LocalOrigin);
  ConvertCartesianPoint((IfcVector3 *)&x.z,in);
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&y.z,1.0,0.0,0.0);
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&z.z,0.0,1.0,0.0);
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&op2,0.0,0.0,1.0);
  bVar1 = STEP::Maybe::operator_cast_to_bool
                    ((Maybe *)&(op->super_IfcGeometricRepresentationItem).field_0x30);
  if (bVar1) {
    pLVar3 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                       ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
                        &(op->super_IfcGeometricRepresentationItem).field_0x30);
    pIVar4 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar3);
    ConvertDirection((IfcVector3 *)&y.z,pIVar4);
  }
  bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&op->Axis2);
  if (bVar1) {
    pLVar3 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                       (&op->Axis2);
    pIVar4 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar3);
    ConvertDirection((IfcVector3 *)&z.z,pIVar4);
  }
  pIVar2 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3D>
                     ((Object *)
                      ((long)&(op->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem
                              .
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper +
                      (long)(op->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                            _vptr_ObjectHelper[-3]));
  if ((pIVar2 != (IfcCartesianTransformationOperator3D *)0x0) &&
     (bVar1 = STEP::Maybe::operator_cast_to_bool
                        ((Maybe *)&(pIVar2->super_IfcCartesianTransformationOperator).field_0x78),
     bVar1)) {
    pLVar3 = STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                       ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
                        &(pIVar2->super_IfcCartesianTransformationOperator).field_0x78);
    pIVar4 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::operator*(pLVar3);
    ConvertDirection((IfcVector3 *)&op2,pIVar4);
  }
  aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)&vscale.z);
  aiMatrix4x4t<double>::Translation((aiVector3t<double> *)&x.z,(aiMatrix4x4t<double> *)&vscale.z);
  AssignMatrixAxes(out,(IfcVector3 *)&y.z,(IfcVector3 *)&z.z,(IfcVector3 *)&op2);
  aiVector3t<double>::aiVector3t((aiVector3t<double> *)&nuni);
  pIVar5 = STEP::Object::
           ToPtr<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform>
                     ((Object *)
                      ((long)&(op->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem
                              .
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                              ._vptr_ObjectHelper +
                      (long)(op->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                            _vptr_ObjectHelper[-3]));
  if (pIVar5 == (IfcCartesianTransformationOperator3DnonUniform *)0x0) {
    bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&op->Scale);
    if (bVar1) {
      pdVar6 = STEP::Maybe<double>::Get(&op->Scale);
      local_2e0 = *pdVar6;
    }
    else {
      local_2e0 = 1.0;
    }
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&s.d4,local_2e0,local_2e0,local_2e0);
    nuni = (IfcCartesianTransformationOperator3DnonUniform *)s.d4;
    vscale.x = local_138;
    vscale.y = local_130;
  }
  else {
    bVar1 = STEP::Maybe::operator_cast_to_bool
                      ((Maybe *)&(pIVar5->super_IfcCartesianTransformationOperator3D).
                                 super_IfcCartesianTransformationOperator.Scale);
    if (bVar1) {
      pdVar6 = STEP::Maybe<double>::Get(&op->Scale);
      local_2c8 = (IfcCartesianTransformationOperator3DnonUniform *)*pdVar6;
    }
    else {
      local_2c8 = (IfcCartesianTransformationOperator3DnonUniform *)0x3ff0000000000000;
    }
    nuni = local_2c8;
    bVar1 = STEP::Maybe::operator_cast_to_bool
                      ((Maybe *)&(pIVar5->super_IfcCartesianTransformationOperator3D).field_0x98);
    if (bVar1) {
      pdVar6 = STEP::Maybe<double>::Get
                         ((Maybe<double> *)
                          &(pIVar5->super_IfcCartesianTransformationOperator3D).field_0x98);
      local_2d0 = *pdVar6;
    }
    else {
      local_2d0 = 1.0;
    }
    vscale.x = local_2d0;
    bVar1 = STEP::Maybe::operator_cast_to_bool((Maybe *)&pIVar5->Scale3);
    if (bVar1) {
      pdVar6 = STEP::Maybe<double>::Get(&pIVar5->Scale3);
      local_2d8 = *pdVar6;
    }
    else {
      local_2d8 = 1.0;
    }
    vscale.y = local_2d8;
  }
  aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_1c0);
  aiMatrix4x4t<double>::Scaling((aiVector3t<double> *)&nuni,(aiMatrix4x4t<double> *)local_1c0);
  aiMatrix4x4t<double>::operator*(&local_2c0,(aiMatrix4x4t<double> *)&vscale.z,out);
  aiMatrix4x4t<double>::operator*(&local_240,&local_2c0,(aiMatrix4x4t<double> *)local_1c0);
  memcpy(out,&local_240,0x80);
  return;
}

Assistant:

void ConvertTransformOperator(IfcMatrix4& out, const Schema_2x3::IfcCartesianTransformationOperator& op)
{
    IfcVector3 loc;
    ConvertCartesianPoint(loc,op.LocalOrigin);

    IfcVector3 x(1.f,0.f,0.f),y(0.f,1.f,0.f),z(0.f,0.f,1.f);
    if (op.Axis1) {
        ConvertDirection(x,*op.Axis1.Get());
    }
    if (op.Axis2) {
        ConvertDirection(y,*op.Axis2.Get());
    }
    if (const Schema_2x3::IfcCartesianTransformationOperator3D* op2 = op.ToPtr<Schema_2x3::IfcCartesianTransformationOperator3D>()) {
        if(op2->Axis3) {
            ConvertDirection(z,*op2->Axis3.Get());
        }
    }

    IfcMatrix4 locm;
    IfcMatrix4::Translation(loc,locm);
    AssignMatrixAxes(out,x,y,z);


    IfcVector3 vscale;
    if (const Schema_2x3::IfcCartesianTransformationOperator3DnonUniform* nuni = op.ToPtr<Schema_2x3::IfcCartesianTransformationOperator3DnonUniform>()) {
        vscale.x = nuni->Scale?op.Scale.Get():1.f;
        vscale.y = nuni->Scale2?nuni->Scale2.Get():1.f;
        vscale.z = nuni->Scale3?nuni->Scale3.Get():1.f;
    }
    else {
        const IfcFloat sc = op.Scale?op.Scale.Get():1.f;
        vscale = IfcVector3(sc,sc,sc);
    }

    IfcMatrix4 s;
    IfcMatrix4::Scaling(vscale,s);

    out = locm * out * s;
}